

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_descriptor_set_layout_ci
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  uint uVar1;
  VkDescriptorSetLayoutBinding *pVVar2;
  bool bVar3;
  uint32_t j;
  ulong uVar4;
  ulong uVar5;
  VkSampler *out_sampler;
  
  for (uVar5 = 0; uVar1 = info->bindingCount, uVar5 < uVar1; uVar5 = uVar5 + 1) {
    pVVar2 = info->pBindings;
    out_sampler = pVVar2[uVar5].pImmutableSamplers;
    if ((out_sampler != (VkSampler *)0x0) &&
       (pVVar2[uVar5].descriptorType < VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE)) {
      uVar4 = 0;
      while (uVar4 < pVVar2[uVar5].descriptorCount) {
        bVar3 = remap_sampler_handle(this,*out_sampler,out_sampler);
        uVar4 = uVar4 + 1;
        out_sampler = out_sampler + 1;
        if (!bVar3) goto LAB_00156f73;
      }
    }
  }
LAB_00156f73:
  return uVar1 <= uVar5;
}

Assistant:

bool StateRecorder::Impl::remap_descriptor_set_layout_ci(VkDescriptorSetLayoutCreateInfo *info)
{
	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			auto *immutable_samplers = const_cast<VkSampler *>(b.pImmutableSamplers);
			for (uint32_t j = 0; j < b.descriptorCount; j++)
				if (!remap_sampler_handle(immutable_samplers[j], &immutable_samplers[j]))
					return false;
		}
	}

	return true;
}